

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> *field)

{
  size_t *psVar1;
  pointer *pppVVar2;
  iterator __position;
  StartModuleField *pSVar3;
  ModuleField *pMVar4;
  ModuleFieldList *pMVar5;
  Var *local_18;
  
  local_18 = &((field->_M_t).
               super___uniq_ptr_impl<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::StartModuleField_*,_std::default_delete<wabt::StartModuleField>_>
               .super__Head_base<0UL,_wabt::StartModuleField_*,_false>._M_head_impl)->start;
  __position._M_current =
       (this->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::Var*,std::allocator<wabt::Var*>>::_M_realloc_insert<wabt::Var*>
              ((vector<wabt::Var*,std::allocator<wabt::Var*>> *)&this->starts,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppVVar2 = &(this->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
    *pppVVar2 = *pppVVar2 + 1;
  }
  pSVar3 = (field->_M_t).
           super___uniq_ptr_impl<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::StartModuleField_*,_std::default_delete<wabt::StartModuleField>_>
           .super__Head_base<0UL,_wabt::StartModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::StartModuleField_*,_std::default_delete<wabt::StartModuleField>_>.
  super__Head_base<0UL,_wabt::StartModuleField_*,_false>._M_head_impl = (StartModuleField *)0x0;
  if ((*(ModuleField **)
        ((long)&(pSVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField + 0x10)
       == (ModuleField *)0x0) &&
     (((intrusive_list_base<wabt::ModuleField> *)
      ((long)&(pSVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField + 8))->
      next_ == (ModuleField *)0x0)) {
    pMVar4 = (this->fields).last_;
    if (pMVar4 == (ModuleField *)0x0) {
      pMVar5 = &this->fields;
    }
    else {
      *(ModuleField **)
       ((long)&(pSVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField + 0x10)
           = pMVar4;
      pMVar5 = (ModuleFieldList *)&pMVar4->super_intrusive_list_base<wabt::ModuleField>;
    }
    pMVar5->first_ = (ModuleField *)pSVar3;
    (this->fields).last_ = (ModuleField *)pSVar3;
    psVar1 = &(this->fields).size_;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<StartModuleField> field) {
  starts.push_back(&field->start);
  fields.push_back(std::move(field));
}